

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiftMotor.h
# Opt level: O0

void __thiscall LiftMotor::UpdateSwitches(LiftMotor *this,int z)

{
  int z_local;
  LiftMotor *this_local;
  
  if (z == this->zmax) {
    this->LimitSwitchTop = true;
    this->LimitSwitchBottom = false;
  }
  else if (z == this->zmin) {
    this->LimitSwitchTop = false;
    this->LimitSwitchBottom = true;
  }
  else {
    this->LimitSwitchTop = false;
    this->LimitSwitchBottom = false;
  }
  return;
}

Assistant:

void LiftMotor::UpdateSwitches(int z)
{
	if (z == zmax)
	{
		LimitSwitchTop = true;
		LimitSwitchBottom = false;
	}

	else if (z == zmin)
	{
		LimitSwitchTop = false;
		LimitSwitchBottom = true;
	}

	else
	{
		LimitSwitchTop = false;
		LimitSwitchBottom = false;
	}
}